

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

VkResult Fossilize::CreateShaderModule
                   (VkDevice device,VkShaderModuleCreateInfo *pCreateInfo,
                   VkAllocationCallbacks *pCallbacks,VkShaderModule *pShaderModule)

{
  bool bVar1;
  VkResult VVar2;
  LogLevel LVar3;
  Device *pDVar4;
  VkShaderModuleCreateInfo *create_info;
  VkShaderModuleIdentifierEXT identifier;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT identifierCreateInfo;
  VkShaderModuleCreateInfo tmpCreateInfo;
  VkShaderModuleIdentifierEXT local_b8;
  undefined8 local_78;
  void *pvStack_70;
  undefined8 local_68;
  uint8_t *puStack_60;
  VkShaderModuleCreateInfo local_58;
  
  pDVar4 = get_device_layer(*(VkDevice *)device);
  *pShaderModule = (VkShaderModule)0x0;
  VVar2 = (*pDVar4->pTable->CreateShaderModule)(device,pCreateInfo,pCallbacks,pShaderModule);
  if (VVar2 == VK_SUCCESS) {
    local_68 = 0;
    puStack_60 = (uint8_t *)0x0;
    local_78 = 0x3ba1d6b2;
    pvStack_70 = (void *)0x0;
    local_b8.pNext = (void *)0x0;
    local_b8.identifier[0xc] = '\0';
    local_b8.identifier[0xd] = '\0';
    local_b8.identifier[0xe] = '\0';
    local_b8.identifier[0xf] = '\0';
    local_b8.identifier[0x10] = '\0';
    local_b8.identifier[0x11] = '\0';
    local_b8.identifier[0x12] = '\0';
    local_b8.identifier[0x13] = '\0';
    local_b8.identifier[0x14] = '\0';
    local_b8.identifier[0x15] = '\0';
    local_b8.identifier[0x16] = '\0';
    local_b8.identifier[0x17] = '\0';
    local_b8.identifier[0x18] = '\0';
    local_b8.identifier[0x19] = '\0';
    local_b8.identifier[0x1a] = '\0';
    local_b8.identifier[0x1b] = '\0';
    local_b8.identifierSize = 0;
    local_b8.identifier[0] = '\0';
    local_b8.identifier[1] = '\0';
    local_b8.identifier[2] = '\0';
    local_b8.identifier[3] = '\0';
    local_b8.identifier[4] = '\0';
    local_b8.identifier[5] = '\0';
    local_b8.identifier[6] = '\0';
    local_b8.identifier[7] = '\0';
    local_b8.identifier[8] = '\0';
    local_b8.identifier[9] = '\0';
    local_b8.identifier[10] = '\0';
    local_b8.identifier[0xb] = '\0';
    local_b8.identifier[0x1c] = '\0';
    local_b8.identifier[0x1d] = '\0';
    local_b8.identifier[0x1e] = '\0';
    local_b8.identifier[0x1f] = '\0';
    local_b8._52_4_ = 0;
    local_b8.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT;
    local_b8._4_4_ = 0;
    create_info = pCreateInfo;
    if (pDVar4->usesModuleIdentifiers == true) {
      (*pDVar4->pTable->GetShaderModuleIdentifierEXT)(device,*pShaderModule,&local_b8);
      puStack_60 = local_b8.identifier;
      local_58.pNext = &local_78;
      local_68 = CONCAT44(local_68._4_4_,local_b8.identifierSize);
      local_58.sType = pCreateInfo->sType;
      local_58._4_4_ = *(undefined4 *)&pCreateInfo->field_0x4;
      pvStack_70 = pCreateInfo->pNext;
      local_58.flags = pCreateInfo->flags;
      local_58._20_4_ = *(undefined4 *)&pCreateInfo->field_0x14;
      local_58.codeSize = pCreateInfo->codeSize;
      create_info = &local_58;
      local_58.pCode = pCreateInfo->pCode;
    }
    bVar1 = StateRecorder::record_shader_module(pDVar4->recorder,*pShaderModule,create_info,0);
    if (!bVar1) {
      LVar3 = get_thread_log_level();
      if ((int)LVar3 < 2) {
        bVar1 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Failed to record shader module, usually caused by unsupported pNext.\n")
        ;
        if (!bVar1) {
          CreateShaderModule();
        }
      }
    }
  }
  return VVar2;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateShaderModule(VkDevice device, const VkShaderModuleCreateInfo *pCreateInfo,
                                                         const VkAllocationCallbacks *pCallbacks,
                                                         VkShaderModule *pShaderModule)
{
	auto *layer = get_device_layer(device);

	*pShaderModule = VK_NULL_HANDLE;

	auto res = layer->getTable()->CreateShaderModule(device, pCreateInfo, pCallbacks, pShaderModule);

	if (res == VK_SUCCESS)
	{
		// Pass along the module identifier for later reference.
		VkPipelineShaderStageModuleIdentifierCreateInfoEXT identifierCreateInfo =
				{ VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT };
		VkShaderModuleIdentifierEXT identifier =
				{ VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT };
		VkShaderModuleCreateInfo tmpCreateInfo;

		if (layer->requiresModuleIdentifiers())
		{
			layer->getTable()->GetShaderModuleIdentifierEXT(device, *pShaderModule, &identifier);
			identifierCreateInfo.pIdentifier = identifier.identifier;
			identifierCreateInfo.identifierSize = identifier.identifierSize;
			tmpCreateInfo = *pCreateInfo;
			identifierCreateInfo.pNext = tmpCreateInfo.pNext;
			tmpCreateInfo.pNext = &identifierCreateInfo;
			pCreateInfo = &tmpCreateInfo;
		}

		if (!layer->getRecorder().record_shader_module(*pShaderModule, *pCreateInfo))
			LOGW_LEVEL("Failed to record shader module, usually caused by unsupported pNext.\n");
	}

	return res;
}